

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

uint32_t reconstructDFDBytesPlane0FromSamples(uint32_t *DFD)

{
  uint uVar1;
  uint32_t sampleBitLength;
  int32_t sampleBitOffset;
  uint32_t sampleNumberWithLargestOffset;
  int32_t largestOffset;
  uint32_t bitsPlane0;
  uint32_t sampleNumber;
  uint32_t numSamples;
  uint32_t *BDFDB;
  uint32_t *DFD_local;
  uint local_4;
  
  uVar1 = (DFD[2] >> 0x12) - 6 >> 2;
  largestOffset = 0;
  sampleNumberWithLargestOffset = 0;
  if ((DFD[7] >> 0x18 & 0xf) == 0xe) {
    if (uVar1 == 1) {
      if ((DFD[7] >> 0x10 & 0xff) == 0x17) {
        return 4;
      }
    }
    else if (uVar1 == 2) {
      if ((DFD[7] >> 0x10 & 0xff) == 0xf) {
        return 4;
      }
      if (((DFD[7] >> 0x10 & 0xff) == 0x1f) && ((DFD[0xb] >> 0x18 & 0xf) == 0xd)) {
        return 8;
      }
    }
  }
  if ((DFD[3] & 0xff) == 0xa3) {
    local_4 = 8;
  }
  else {
    for (sampleNumber = 0; sampleNumber < uVar1; sampleNumber = sampleNumber + 1) {
      if ((uint)largestOffset < (DFD[(ulong)(sampleNumber * 4 + 6) + 1] & 0xffff)) {
        sampleNumberWithLargestOffset = sampleNumber;
        largestOffset = DFD[(ulong)(sampleNumber * 4 + 6) + 1] & 0xffff;
      }
    }
    local_4 = largestOffset +
              (DFD[(ulong)(sampleNumberWithLargestOffset * 4 + 6) + 1] >> 0x10 & 0xff) + 1 >> 3;
  }
  return local_4;
}

Assistant:

uint32_t
reconstructDFDBytesPlane0FromSamples(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    uint32_t bitsPlane0 = 0;
    int32_t largestOffset = 0;
    uint32_t sampleNumberWithLargestOffset = 0;

    // Special case these depth{,-stencil} formats. The unused bits are
    // in the MSBs so have no visibility in the DFD therefore the max offset
    // algorithm below returns a value that is too small.
    if (KHR_DFDSVAL(BDFDB, 0, CHANNELID) == KHR_DF_CHANNEL_COMMON_DEPTH) {
        if (numSamples == 1) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 24) {
                // X8_D24_UNORM_PACK32,
                return 4;
            }
        } else if (numSamples == 2) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 16) {
                // D16_UNORM_S8_UINT
                return 4;
            }
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 32
                && KHR_DFDSVAL(BDFDB, 1, CHANNELID) == KHR_DF_CHANNEL_COMMON_STENCIL) {
                // D32_SFLOAT_S8_UINT
                return 8;
            }
        }
    }
    if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_ETC1S) {
        // Size of the first plane.
        return 8;
    }
    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        int32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleNumber, BITOFFSET);
        if (sampleBitOffset > largestOffset) {
            largestOffset = sampleBitOffset;
            sampleNumberWithLargestOffset = sampleNumber;
        }
    }

    /* The sample bitLength field stores the bit length - 1. */
    uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleNumberWithLargestOffset, BITLENGTH) + 1;
    bitsPlane0 = largestOffset + sampleBitLength;
    return bitsPlane0 >> 3U;
}